

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O3

bool __thiscall cmStateDirectory::GetPropertyAsBool(cmStateDirectory *this,string *prop)

{
  bool bVar1;
  cmValue cVar2;
  char *extraout_RDX;
  string_view value;
  
  bVar1 = cmState::IsPropertyChained((this->Snapshot_).State,prop,DIRECTORY);
  cVar2 = GetProperty(this,prop,bVar1);
  if (cVar2.Value != (string *)0x0) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar2.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar2.Value)->_M_string_length,value);
    return bVar1;
  }
  return false;
}

Assistant:

bool cmStateDirectory::GetPropertyAsBool(const std::string& prop) const
{
  return cmIsOn(this->GetProperty(prop));
}